

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O3

int64_t duckdb_nanoarrow::ArrowMetadataSizeOf(char *metadata)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  if (metadata == (char *)0x0) {
    return 0;
  }
  if (0 < *(int *)metadata) {
    uVar3 = *(int *)metadata + 1;
    lVar2 = 4;
    lVar4 = 4;
    do {
      lVar5 = (long)*(int *)(metadata + lVar4);
      lVar1 = lVar5 + 4 + lVar4;
      lVar4 = lVar4 + lVar5 + (long)*(int *)(metadata + lVar1) + 8;
      lVar2 = lVar2 + lVar5 + (long)*(int *)(metadata + lVar1) + 8;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
    return lVar2;
  }
  return 4;
}

Assistant:

int64_t ArrowMetadataSizeOf(const char *metadata) {
	if (metadata == NULL) {
		return 0;
	}

	struct ArrowMetadataReader reader;
	struct ArrowStringView key;
	struct ArrowStringView value;
	ArrowMetadataReaderInit(&reader, metadata);

	int64_t size = sizeof(int32_t);
	while (ArrowMetadataReaderRead(&reader, &key, &value) == NANOARROW_OK) {
		size += sizeof(int32_t) + uint64_t(key.n_bytes) + sizeof(int32_t) + uint64_t(value.n_bytes);
	}

	return size;
}